

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int32_t nghttp2_session_get_stream_local_window_size(nghttp2_session *session,int32_t stream_id)

{
  int32_t iVar1;
  nghttp2_stream *pnVar2;
  int iVar3;
  
  pnVar2 = nghttp2_session_get_stream(session,stream_id);
  if (pnVar2 != (nghttp2_stream *)0x0) {
    iVar3 = pnVar2->local_window_size - pnVar2->recv_window_size;
    iVar1 = 0;
    if (0 < iVar3) {
      iVar1 = iVar3;
    }
    return iVar1;
  }
  return -1;
}

Assistant:

int32_t nghttp2_session_get_stream_local_window_size(nghttp2_session *session,
                                                     int32_t stream_id) {
  nghttp2_stream *stream;
  int32_t size;
  stream = nghttp2_session_get_stream(session, stream_id);
  if (stream == NULL) {
    return -1;
  }

  size = stream->local_window_size - stream->recv_window_size;

  /* size could be negative if local endpoint reduced
     SETTINGS_INITIAL_WINDOW_SIZE */
  if (size < 0) {
    return 0;
  }

  return size;
}